

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_print.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  kvtree *hash;
  int long_index;
  int local_4c;
  char *local_48;
  undefined8 local_40;
  undefined4 local_34;
  
  local_34 = 0;
  local_48 = (char *)0x0;
  bVar3 = false;
  local_4c = 0;
  do {
    iVar4 = getopt_long(argc,argv,"m:h",main::long_options,&local_34);
    if (iVar4 == -1) {
      bVar2 = false;
    }
    else if (iVar4 == 0x68) {
      bVar2 = true;
      bVar3 = true;
    }
    else if (iVar4 == 0x6d) {
      local_48 = strdup(_optarg);
      bVar2 = true;
    }
    else {
      printf("ERROR: Unknown option: `%s\'\n",argv[(long)_optind + -1]);
      bVar2 = true;
      bVar3 = true;
      local_4c = 1;
    }
  } while (bVar2);
  if ((!bVar3) && (argc - _optind != 1)) {
    puts("ERROR: Missing file name or too many files");
    bVar3 = true;
    local_4c = 1;
  }
  if (local_48 == (char *)0x0) {
    uVar5 = 1;
    goto LAB_00101337;
  }
  iVar4 = strcmp(local_48,"tree");
  if (iVar4 == 0) {
LAB_0010131c:
    uVar5 = 1;
  }
  else {
    iVar4 = strcmp(local_48,"keyval");
    if (iVar4 != 0) {
      printf("ERROR: Invalid mode name: `%s\'\n",local_48);
      bVar3 = true;
      local_4c = 1;
      goto LAB_0010131c;
    }
    uVar5 = 2;
  }
  free(local_48);
LAB_00101337:
  if (bVar3) {
    putchar(10);
    puts("Usage: kvtree_print [options] <file>");
    putchar(10);
    puts("  Options:");
    puts("    -m, --mode <mode>  Specify print format: \"tree\" or \"keyval\" (default tree)");
    puts("    -h, --help         Print usage");
    putchar(10);
  }
  else {
    pcVar1 = argv[_optind];
    local_40 = kvtree_new();
    iVar4 = kvtree_read_file(pcVar1,local_40);
    if (iVar4 == 0) {
      kvtree_print_mode(local_40,0,uVar5);
    }
    else {
      printf("ERROR: Failed to read file: `%s\'\n",pcVar1);
      local_4c = 1;
    }
    kvtree_delete(&local_40);
  }
  return local_4c;
}

Assistant:

int main(int argc, char* argv[])
{
  int rc = 0;

  static const char *opt_string = "m:h";
  static struct option long_options[] = {
    {"mode",    required_argument, NULL, 'm'},
    {"help",    no_argument,       NULL, 'h'},
    {NULL,      no_argument,       NULL,   0}
  };

  int usage = 0;
  char* mode = NULL;

  int long_index = 0;
  while (1) {
    int c = getopt_long(argc, argv, opt_string, long_options, &long_index);
    if (c == -1) {
      break;
    }

    switch(c) {
      case 'm':
        mode = strdup(optarg);
        break;
      case 'h':
        usage = 1;
        break;
      default:
        printf("ERROR: Unknown option: `%s'\n", argv[optind-1]);
        usage = 1;
        rc = 1;
        break;
    }
  }

  /* check that we were given exactly one filename argument */
  int numargs = argc - optind;
  if (!usage && numargs != 1) {
    printf("ERROR: Missing file name or too many files\n");
    usage = 1;
    rc = 1;
  }

  /* parse the print mode option, if one is given */
  int print_mode = KVTREE_PRINT_TREE;
  if (mode != NULL) {
    if (strcmp(mode, "tree") == 0) {
      print_mode = KVTREE_PRINT_TREE;
    } else if (strcmp(mode, "keyval") == 0) {
      print_mode = KVTREE_PRINT_KEYVAL;
    } else {
      printf("ERROR: Invalid mode name: `%s'\n", mode);
      usage = 1;
      rc = 1;
    }
    free(mode);
  }

  if (usage) {
    print_usage();
    return rc;
  }

  /* get the file name */
  char* filename = argv[optind];

  /* read in the file */
  kvtree* hash = kvtree_new();
  if (kvtree_read_file(filename, hash) == KVTREE_SUCCESS) {
    /* we read the file, now print it out */
    kvtree_print_mode(hash, 0, print_mode);
  } else {
    printf("ERROR: Failed to read file: `%s'\n", filename);
    rc = 1;
  }
  kvtree_delete(&hash);

  return rc;
}